

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varenaalloc.h
# Opt level: O3

Trim * __thiscall
VArenaAlloc::make<rlottie::internal::renderer::Trim,rlottie::internal::model::Trim*>
          (VArenaAlloc *this,Trim **args)

{
  int iVar1;
  Trim *pTVar2;
  Trim *pTVar3;
  
  pTVar3 = (Trim *)allocObjectWithFooter(this,0x68,8);
  iVar1 = *(int *)&this->fCursor;
  this->fCursor = (char *)(pTVar3 + 1);
  installFooter(this,make<rlottie::internal::renderer::Trim,_rlottie::internal::model::Trim_*>::
                     anon_class_1_0_00000001::__invoke,(int)pTVar3 - iVar1);
  pTVar2 = *args;
  (pTVar3->super_Object)._vptr_Object = (_func_int **)&PTR__Trim_00144b58;
  (pTVar3->mCache).mFrameNo = -1;
  (pTVar3->mCache).mSegment.start = 0.0;
  (pTVar3->mCache).mSegment.end = 0.0;
  (pTVar3->mPathItems).
  super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar3->mPathItems).
  super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar3->mPathItems).
  super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar3->mData = pTVar2;
  (pTVar3->mPathMesure).mStart = 0.0;
  (pTVar3->mPathMesure).mEnd = 1.0;
  vcow_ptr<VPath::VPathData>::vcow_ptr(&(pTVar3->mPathMesure).mScratchObject.d);
  pTVar3->mDirty = true;
  (pTVar3->mModel).super_FilterBase<rlottie::internal::model::Trim>.model_ = pTVar2;
  (pTVar3->mModel).super_FilterBase<rlottie::internal::model::Trim>.filterData_._M_t.
  super___uniq_ptr_impl<rlottie::internal::model::FilterData,_std::default_delete<rlottie::internal::model::FilterData>_>
  ._M_t.
  super__Tuple_impl<0UL,_rlottie::internal::model::FilterData_*,_std::default_delete<rlottie::internal::model::FilterData>_>
  .super__Head_base<0UL,_rlottie::internal::model::FilterData_*,_false>._M_head_impl =
       (FilterData *)0x0;
  return pTVar3;
}

Assistant:

T* make(Args&&... args) {
        uint32_t size      = ToU32(sizeof(T));
        uint32_t alignment = ToU32(alignof(T));
        char* objStart;
        if (std::is_trivially_destructible<T>::value) {
            objStart = this->allocObject(size, alignment);
            fCursor = objStart + size;
        } else {
            objStart = this->allocObjectWithFooter(size + sizeof(Footer), alignment);
            // Can never be UB because max value is alignof(T).
            uint32_t padding = ToU32(objStart - fCursor);

            // Advance to end of object to install footer.
            fCursor = objStart + size;
            FooterAction* releaser = [](char* objEnd) {
                char* objStart = objEnd - (sizeof(T) + sizeof(Footer));
                ((T*)objStart)->~T();
                return objStart;
            };
            this->installFooter(releaser, padding);
        }

        // This must be last to make objects with nested use of this allocator work.
        return new(objStart) T(std::forward<Args>(args)...);
    }